

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

uint xmlGlobalRandom(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  xmlMutexLock(&xmlRngMutex);
  uVar1 = globalRngState_0 * -0x61c88645;
  uVar3 = globalRngState_0 * -0x3910c8a0;
  uVar2 = globalRngState_1 ^ globalRngState_0;
  globalRngState_0 = uVar2 << 9 ^ (globalRngState_0 << 0x1a | globalRngState_0 >> 6) ^ uVar2;
  globalRngState_1 = uVar2 << 0xd | uVar2 >> 0x13;
  xmlMutexUnlock(&xmlRngMutex);
  return (uVar1 >> 0x1b | uVar3) * 5;
}

Assistant:

unsigned
xmlGlobalRandom(void) {
    unsigned ret;

    xmlMutexLock(&xmlRngMutex);
    ret = xoroshiro64ss(globalRngState);
    xmlMutexUnlock(&xmlRngMutex);

    return(ret);
}